

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bicubic.h
# Opt level: O1

void ncnn::cubic_coeffs(int w,int outw,int *xofs,float *alpha,int align_corner)

{
  undefined8 uVar1;
  double dVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  ulong uVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  if (align_corner == 0) {
    dVar11 = (double)w;
    dVar12 = (double)outw;
  }
  else {
    dVar11 = (double)(w + -1);
    dVar12 = (double)(outw + -1);
  }
  if (0 < outw) {
    uVar9 = 0;
    auVar14._8_4_ = 0x3f800000;
    auVar14._0_8_ = 0x3f8000003f800000;
    auVar14._12_4_ = 0x3f800000;
    do {
      dVar2 = ((double)(int)uVar9 + 0.5) * (dVar11 / dVar12) + -0.5;
      if (align_corner != 0) {
        dVar2 = (double)(int)uVar9 * (dVar11 / dVar12);
      }
      auVar15._0_4_ = (float)dVar2;
      auVar15._4_4_ = (int)((ulong)dVar2 >> 0x20);
      auVar15._8_8_ = 0;
      auVar6 = vroundss_avx(auVar15,auVar15,9);
      iVar10 = (int)auVar6._0_4_;
      fVar7 = auVar15._0_4_ - auVar6._0_4_;
      fVar8 = 1.0 - fVar7;
      auVar6 = vblendps_avx(ZEXT416((uint)((fVar7 + 1.0) * -6.0 + 3.0)),auVar14,0xe);
      auVar15 = vinsertps_avx(ZEXT416((uint)(fVar7 + 1.0)),ZEXT416((uint)fVar7),0x10);
      fVar7 = auVar15._0_4_;
      fVar3 = auVar15._4_4_;
      fVar4 = auVar15._8_4_;
      fVar5 = auVar15._12_4_;
      auVar16._0_4_ = fVar7 * 0.75;
      auVar16._4_4_ = fVar3 * 1.25;
      auVar16._8_4_ = fVar4 * 0.0;
      auVar16._12_4_ = fVar5 * 0.0;
      auVar15 = vsubps_avx(SUB6416(ZEXT464(0x40700000),0),auVar16);
      auVar17._0_4_ = auVar16._0_4_ + -2.25;
      auVar17._4_4_ = auVar16._4_4_ + -2.25;
      auVar17._8_4_ = auVar16._8_4_ + -2.25;
      auVar17._12_4_ = auVar16._12_4_ + -2.25;
      auVar15 = vblendps_avx(auVar15,auVar17,2);
      auVar13._0_4_ = fVar7 * fVar7 * auVar15._0_4_ + auVar6._0_4_;
      auVar13._4_4_ = fVar3 * fVar3 * auVar15._4_4_ + auVar6._4_4_;
      auVar13._8_4_ = fVar4 * fVar4 * auVar15._8_4_ + auVar6._8_4_;
      auVar13._12_4_ = fVar5 * fVar5 * auVar15._12_4_ + auVar6._12_4_;
      uVar1 = vmovlps_avx(auVar13);
      *(undefined8 *)alpha = uVar1;
      fVar7 = (fVar8 * 1.25 + -2.25) * fVar8 * fVar8;
      alpha[2] = fVar7 + 1.0;
      auVar6 = vmovshdup_avx(auVar13);
      alpha[3] = -(auVar6._0_4_ + fVar7 + auVar13._0_4_);
      if (iVar10 < 0) {
        *alpha = 1.0 - alpha[3];
        alpha[1] = alpha[3];
        alpha[2] = 0.0;
        alpha[3] = 0.0;
        iVar10 = 1;
      }
      if (iVar10 == 0) {
        *alpha = alpha[1] + *alpha;
        *(undefined8 *)(alpha + 1) = *(undefined8 *)(alpha + 2);
        alpha[3] = 0.0;
        iVar10 = 1;
      }
      if (iVar10 == w + -2) {
        alpha[3] = alpha[3] + alpha[2];
        *(undefined8 *)(alpha + 1) = *(undefined8 *)alpha;
        *alpha = 0.0;
        iVar10 = w + -3;
      }
      if (w + -1 <= iVar10) {
        alpha[3] = 1.0 - *alpha;
        alpha[2] = *alpha;
        alpha[0] = 0.0;
        alpha[1] = 0.0;
        iVar10 = w + -3;
      }
      xofs[uVar9] = iVar10;
      uVar9 = uVar9 + 1;
      alpha = alpha + 4;
    } while ((uint)outw != uVar9);
  }
  return;
}

Assistant:

static void cubic_coeffs(int w, int outw, int* xofs, float* alpha, int align_corner)
{
    double scale = (double)w / outw;
    if (align_corner)
    {
        scale = (double)(w - 1) / (outw - 1);
    }

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        if (align_corner)
        {
            fx = (float)(dx * scale);
        }

        int sx = static_cast<int>(floor(fx));
        fx -= sx;

        interpolate_cubic(fx, alpha + dx * 4);

        if (sx <= -1)
        {
            sx = 1;
            alpha[dx * 4 + 0] = 1.f - alpha[dx * 4 + 3];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = 0.f;
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == 0)
        {
            sx = 1;
            alpha[dx * 4 + 0] = alpha[dx * 4 + 0] + alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 2];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == w - 2)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = alpha[dx * 4 + 2] + alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 0] = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = 1.f - alpha[dx * 4 + 0];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 1] = 0.f;
            alpha[dx * 4 + 0] = 0.f;
        }

        xofs[dx] = sx;
    }
}